

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWgammaramp * glfwGetGammaRamp(GLFWmonitor *handle)

{
  GLFWbool GVar1;
  long in_RDI;
  _GLFWmonitor *monitor;
  undefined8 local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (GLFWgammaramp *)0x0;
  }
  else {
    _glfwFreeGammaArrays((GLFWgammaramp *)0x49e616);
    GVar1 = _glfwPlatformGetGammaRamp((_GLFWmonitor *)handle,(GLFWgammaramp *)monitor);
    if (GVar1 == 0) {
      local_8 = (GLFWgammaramp *)0x0;
    }
    else {
      local_8 = (GLFWgammaramp *)(in_RDI + 0x68);
    }
  }
  return local_8;
}

Assistant:

GLFWAPI const GLFWgammaramp* glfwGetGammaRamp(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    _glfwFreeGammaArrays(&monitor->currentRamp);
    if (!_glfwPlatformGetGammaRamp(monitor, &monitor->currentRamp))
        return NULL;

    return &monitor->currentRamp;
}